

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest16 *this,_shader_stage *shader_stage,
          uint *n_id)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream result_sstream;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(&local_1a0,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\n");
  pcVar2 = "out gl_PerVertex { vec4 gl_Position; } ;\n";
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    std::operator<<(&local_1a0,"layout(vertices = 4) out;\n");
    std::operator<<(&local_1a0,"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n");
    pcVar2 = "out gl_PerVertex { vec4 gl_Position; } gl_out[];\n";
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    std::operator<<(&local_1a0,"layout(quads) in;\n");
    std::operator<<(&local_1a0,"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n");
    pcVar2 = "out gl_PerVertex { vec4 gl_Position; };\n";
    break;
  case SHADER_STAGE_GEOMETRY:
    std::operator<<(&local_1a0,
                    "layout(points)                   in;\nlayout(points, max_vertices = 1) out;\n")
    ;
    std::operator<<(&local_1a0,"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n");
    break;
  default:
    goto switchD_00a1d14b_default;
  }
  std::operator<<(&local_1a0,pcVar2);
switchD_00a1d14b_default:
  poVar1 = std::operator<<(&local_1a0,
                           "\nsubroutine void subroutineType (inout vec4 result);\nsubroutine vec4 subroutineType2(in    vec4 data);\n\nsubroutine(subroutineType) void function1(inout vec4 result)\n{\n    result += vec4("
                          );
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,
                           ");\n}\nsubroutine(subroutineType) void function2(inout vec4 result)\n{\n    result += vec4("
                          );
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,
                  ");\n}\n\nsubroutine(subroutineType2) vec4 function3(in vec4 data)\n{\n    return data * data;\n}\nsubroutine(subroutineType2) vec4 function4(in vec4 data)\n{\n    return data + data;\n}\n\nsubroutine uniform subroutineType  subroutine1;\nsubroutine uniform subroutineType  subroutine2;\nsubroutine uniform subroutineType2 subroutine3;\nsubroutine uniform subroutineType2 subroutine4;\n\n"
                 );
  if (*shader_stage == SHADER_STAGE_FRAGMENT) {
    std::operator<<(&local_1a0,"out vec4 result;\n");
  }
  std::operator<<(&local_1a0,"void main()\n{\n");
  poVar1 = &local_1a0;
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    pcVar2 = 
    "    gl_Position = vec4(0);\n    subroutine1(gl_Position);\n    subroutine2(gl_Position);\n    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n"
    ;
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    pcVar2 = 
    "    gl_out[gl_InvocationID].gl_Position = vec4(0);\n    subroutine1(gl_out[gl_InvocationID].gl_Position);\n    subroutine2(gl_out[gl_InvocationID].gl_Position);\n    gl_out[gl_InvocationID].gl_Position = subroutine3(gl_in[0].gl_Position) + subroutine4(gl_in[0].gl_Position);\n"
    ;
    break;
  case SHADER_STAGE_GEOMETRY:
    pcVar2 = 
    "    gl_Position = vec4(0);\n    subroutine1(gl_Position);\n    subroutine2(gl_Position);\n    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n    EmitVertex();\n"
    ;
    break;
  case SHADER_STAGE_FRAGMENT:
    poVar1 = std::operator<<(&local_1a0,"    result = vec4(0);\n");
    pcVar2 = 
    "    subroutine1(result);\n    subroutine2(result);\n    result = subroutine3(result) + subroutine4(result);\n"
    ;
    break;
  default:
    goto switchD_00a1d2fd_default;
  }
  std::operator<<(poVar1,pcVar2);
switchD_00a1d2fd_default:
  std::operator<<(&local_1a0,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest16::getShaderBody(const Utils::_shader_stage& shader_stage, const unsigned int& n_id) const
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n";

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_VERTEX:
	{
		result_sstream << "out gl_PerVertex { vec4 gl_Position; } ;\n";
		break;
	}
	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "layout(points)                   in;\n"
						  "layout(points, max_vertices = 1) out;\n";
		result_sstream << "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		result_sstream << "out gl_PerVertex { vec4 gl_Position; } ;\n";
		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "layout(vertices = 4) out;\n";
		result_sstream << "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		result_sstream << "out gl_PerVertex { vec4 gl_Position; } gl_out[];\n";
		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "layout(quads) in;\n";
		result_sstream << "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		result_sstream << "out gl_PerVertex { vec4 gl_Position; };\n";
		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	result_sstream << "\n"
					  "subroutine void subroutineType (inout vec4 result);\n"
					  "subroutine vec4 subroutineType2(in    vec4 data);\n"
					  "\n"
					  "subroutine(subroutineType) void function1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << (n_id + 1) << ", " << (n_id + 2) << ", " << (n_id + 3) << ", " << (n_id + 4)
				   << ");\n"
					  "}\n"
					  "subroutine(subroutineType) void function2(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << (n_id + 2) << ", " << (n_id + 3) << ", " << (n_id + 4) << ", " << (n_id + 5)
				   << ");\n"
					  "}\n"
					  "\n"
					  "subroutine(subroutineType2) vec4 function3(in vec4 data)\n"
					  "{\n"
					  "    return data * data;\n"
					  "}\n"
					  "subroutine(subroutineType2) vec4 function4(in vec4 data)\n"
					  "{\n"
					  "    return data + data;\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType  subroutine1;\n"
					  "subroutine uniform subroutineType  subroutine2;\n"
					  "subroutine uniform subroutineType2 subroutine3;\n"
					  "subroutine uniform subroutineType2 subroutine4;\n"
					  "\n";

	if (shader_stage == Utils::SHADER_STAGE_FRAGMENT)
	{
		result_sstream << "out vec4 result;\n";
	}

	result_sstream << "void main()\n"
					  "{\n";

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_FRAGMENT:
	{
		result_sstream << "    result = vec4(0);\n"
					   << "    subroutine1(result);\n"
						  "    subroutine2(result);\n"
						  "    result = subroutine3(result) + subroutine4(result);\n";

		break;
	}

	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "    gl_Position = vec4(0);\n"
						  "    subroutine1(gl_Position);\n"
						  "    subroutine2(gl_Position);\n"
						  "    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n"
						  "    EmitVertex();\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "    gl_out[gl_InvocationID].gl_Position = vec4(0);\n"
						  "    subroutine1(gl_out[gl_InvocationID].gl_Position);\n"
						  "    subroutine2(gl_out[gl_InvocationID].gl_Position);\n"
						  "    gl_out[gl_InvocationID].gl_Position = subroutine3(gl_in[0].gl_Position) + "
						  "subroutine4(gl_in[0].gl_Position);\n";

		break;
	}

	case Utils::SHADER_STAGE_VERTEX:
	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "    gl_Position = vec4(0);\n"
						  "    subroutine1(gl_Position);\n"
						  "    subroutine2(gl_Position);\n"
						  "    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n";

		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	result_sstream << "}\n";

	return result_sstream.str();
}